

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_create(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint vnum;
  AREA_DATA_conflict *pAVar2;
  char *pcVar3;
  ROOM_INDEX_DATA *pRVar4;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  char buf [4608];
  int iHash;
  int value;
  ROOM_INDEX_DATA *pRoom;
  AREA_DATA_conflict *pArea;
  char acStackY_1238 [16];
  undefined4 in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffeddc;
  char *in_stack_ffffffffffffede0;
  bool local_1;
  
  vnum = atoi(in_RSI);
  if ((*in_RSI != '\0') && (0 < (int)vnum)) {
    pAVar2 = get_vnum_area(vnum);
    if (pAVar2 != (AREA_DATA_conflict *)0x0) {
      bVar1 = is_switched(in_RDI);
      if ((bVar1) ||
         ((((pAVar2->security < in_RDI->pcdata->security ||
            (pcVar3 = strstr(pAVar2->builders,in_RDI->name), pcVar3 == (char *)0x0)) &&
           (in_RDI->pcdata->security <= pAVar2->security)) &&
          (pcVar3 = strstr(pAVar2->builders,"All"), pcVar3 == (char *)0x0)))) {
        send_to_char(in_stack_ffffffffffffede0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
        local_1 = false;
      }
      else {
        pRVar4 = get_room_index(in_stack_ffffffffffffeddc);
        if (pRVar4 == (ROOM_INDEX_DATA *)0x0) {
          pRVar4 = new_room_index();
          pRVar4->area = pAVar2;
          pRVar4->vnum = (short)vnum;
          if (top_vnum_room < (int)vnum) {
            top_vnum_room = vnum;
          }
          pRVar4->next = room_index_hash[(int)vnum % 0x400];
          room_index_hash[(int)vnum % 0x400] = pRVar4;
          in_RDI->desc->pEdit = pRVar4;
          sprintf(acStackY_1238,"Room #%d created.\n\r",(ulong)vnum);
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
          local_1 = true;
        }
        else {
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
          local_1 = false;
        }
      }
      return local_1;
    }
    send_to_char(in_stack_ffffffffffffede0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
    return false;
  }
  send_to_char(in_stack_ffffffffffffede0,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
  return false;
}

Assistant:

bool redit_create(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	ROOM_INDEX_DATA *pRoom;
	int value;
	int iHash;
	char buf[MSL];

	EDIT_ROOM(ch, pRoom);

	value = atoi(argument);

	if (argument[0] == '\0' || value <= 0)
	{
		send_to_char("Syntax:  create [vnum > 0]\n\r", ch);
		return false;
	}

	pArea = get_vnum_area(value);

	if (!pArea)
	{
		send_to_char("REdit:  That vnum is not assigned an area.\n\r", ch);
		return false;
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Vnum in an area you cannot build in.\n\r", ch);
		return false;
	}

	if (get_room_index(value))
	{
		send_to_char("REdit:  Room vnum already exists.\n\r", ch);
		return false;
	}

	pRoom = new_room_index();
	pRoom->area = pArea;
	pRoom->vnum = value;

	if (value > top_vnum_room)
		top_vnum_room = value;

	iHash = value % MAX_KEY_HASH;
	pRoom->next = room_index_hash[iHash];
	room_index_hash[iHash] = pRoom;
	ch->desc->pEdit = (void *)pRoom;

	sprintf(buf, "Room #%d created.\n\r", value);
	send_to_char(buf, ch);
	return true;
}